

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void snowhouse::DefaultFailureHandler::
     Handle<snowhouse::ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>,int>
               (ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
                *expected,int *actual,char *file_name,int line_number)

{
  ostream *poVar1;
  AssertionException *this;
  allocator local_231;
  string local_230 [32];
  string local_210 [32];
  snowhouse local_1f0 [32];
  snowhouse local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream str;
  int line_number_local;
  char *file_name_local;
  int *actual_local;
  ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
  *expected_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"Expected: ");
  Stringize<snowhouse::ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>>
            (local_1d0,expected);
  poVar1 = std::operator<<(poVar1,(string *)local_1d0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_1d0);
  poVar1 = std::operator<<((ostream *)local_1a0,"Actual: ");
  Stringize<int>(local_1f0,actual);
  poVar1 = std::operator<<(poVar1,(string *)local_1f0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_1f0);
  this = (AssertionException *)__cxa_allocate_exception(0x50);
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,file_name,&local_231);
  AssertionException::AssertionException(this,local_210,(string *)local_230,line_number);
  __cxa_throw(this,&AssertionException::typeinfo,AssertionException::~AssertionException);
}

Assistant:

static void Handle(const ExpectedType& expected, const ActualType& actual, const char* file_name, int line_number)
      {
         std::ostringstream str;

         str << "Expected: " << snowhouse::Stringize(expected) << std::endl;
         str << "Actual: " << snowhouse::Stringize(actual) << std::endl;

         throw AssertionException(str.str(), file_name, line_number);
      }